

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

bool __thiscall cmCPackGenerator::IsSetToOff(cmCPackGenerator *this,string *op)

{
  bool bVar1;
  string *psVar2;
  string_view value;
  
  psVar2 = (string *)cmMakefile::GetDefinition(this->MakefileMap,op);
  if ((psVar2 != (string *)0x0) && (psVar2->_M_string_length != 0)) {
    if (psVar2 == (string *)0x0) {
      psVar2 = &cmValue::Empty_abi_cxx11_;
    }
    value._M_str = (psVar2->_M_dataplus)._M_p;
    value._M_len = psVar2->_M_string_length;
    bVar1 = cmValue::IsOff(value);
    return bVar1;
  }
  return false;
}

Assistant:

bool cmCPackGenerator::IsSetToOff(const std::string& op) const
{
  cmValue ret = this->MakefileMap->GetDefinition(op);
  if (cmNonempty(ret)) {
    return cmIsOff(*ret);
  }
  return false;
}